

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_positionals_abi_cxx11_(Formatter *this,App *app)

{
  bool bVar1;
  function<bool_(const_CLI::Option_*)> *in_RSI;
  string *in_RDI;
  function<bool_(const_CLI::Option_*)> *in_stack_000000b0;
  App *in_stack_000000b8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  string *psVar2;
  string *key;
  FormatterBase *in_stack_ffffffffffffff38;
  allocator local_a9;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_ffffffffffffff58;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_ffffffffffffff60;
  string local_88 [32];
  undefined4 local_68;
  string local_50 [2];
  
  key = local_50;
  psVar2 = in_RDI;
  ::std::function<bool(CLI::Option_const*)>::
  function<CLI::Formatter::make_positionals[abi:cxx11](CLI::App_const*)const::_lambda(CLI::Option_const*)_1_,void>
            (in_RSI,(anon_class_1_0_00000001 *)in_RDI);
  App::get_options(in_stack_000000b8,in_stack_000000b0);
  std::function<bool_(const_CLI::Option_*)>::~function
            ((function<bool_(const_CLI::Option_*)> *)0x12b676);
  bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff58,"positionals",&local_a9);
    FormatterBase::get_label(in_stack_ffffffffffffff38,key);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (**(code **)(*(long *)&(in_RSI->super__Function_base)._M_functor + 0x18))
              (in_RDI,in_RSI,local_88,1,&stack0xffffffffffffff38);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
    ::std::__cxx11::string::~string(local_88);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  local_68 = 1;
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
  return psVar2;
}

Assistant:

CLI11_INLINE std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return {};

    return make_group(get_label("positionals"), true, opts);
}